

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdebug.cpp
# Opt level: O1

void __thiscall QDebug::putUcs4(QDebug *this,uint ucs4)

{
  QTextStream *pQVar1;
  long in_FS_OFFSET;
  QTextStreamManipulator local_48;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->stream->noQuotes == false) {
    ::QTextStream::operator<<(&this->stream->ts,'\'');
  }
  if (ucs4 < 0x20) {
    pQVar1 = ::QTextStream::operator<<(&this->stream->ts,"\\x");
    pQVar1 = Qt::hex(pQVar1);
  }
  else {
    if (ucs4 < 0x80) {
      ::QTextStream::operator<<(&this->stream->ts,(char)ucs4);
      goto LAB_00223433;
    }
    if (ucs4 < 0x10000) {
      pQVar1 = ::QTextStream::operator<<(&this->stream->ts,"\\u");
      local_48.arg = 4;
    }
    else {
      pQVar1 = ::QTextStream::operator<<(&this->stream->ts,"\\U");
      local_48.arg = 8;
    }
    local_48._24_8_ = 0;
    local_48.mc = 0;
    local_48._8_8_ = 0;
    local_48.mf = (QTSMFI)::QTextStream::setFieldWidth;
    local_48.ch.ucs = L'\0';
    QTextStreamManipulator::exec(&local_48,pQVar1);
    pQVar1 = Qt::hex(&this->stream->ts);
    local_48.mf = 0;
    local_48._8_8_ = 0;
    local_48.mc = (QTSMFC)::QTextStream::setPadChar;
    local_48._24_8_ = 0;
    local_48.arg = -1;
    local_48.ch.ucs = L'0';
    QTextStreamManipulator::exec(&local_48,pQVar1);
  }
  pQVar1 = ::QTextStream::operator<<(pQVar1,ucs4);
  Qt::reset(pQVar1);
LAB_00223433:
  if (this->stream->noQuotes == false) {
    ::QTextStream::operator<<(&this->stream->ts,'\'');
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDebug::putUcs4(uint ucs4)
{
    maybeQuote('\'');
    if (ucs4 < 0x20) {
        stream->ts << "\\x" << Qt::hex << ucs4 << Qt::reset;
    } else if (ucs4 < 0x80) {
        stream->ts << char(ucs4);
    } else {
        if (ucs4 < 0x10000)
            stream->ts << "\\u" << qSetFieldWidth(4);
        else
            stream->ts << "\\U" << qSetFieldWidth(8);
        stream->ts << Qt::hex << qSetPadChar(u'0') << ucs4 << Qt::reset;
    }
    maybeQuote('\'');
}